

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

void phosg::skip_whitespace_and_comments(StringReader *r,bool disable_extensions)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  byte *pbVar4;
  size_t sVar5;
  char *pcVar6;
  bool bVar7;
  
  bVar7 = false;
  do {
    bVar3 = StringReader::eof(r);
    if (bVar3) {
      return;
    }
    pbVar4 = (byte *)StringReader::pget<signed_char>(r,r->offset,1);
    bVar1 = *pbVar4;
    if (bVar7) {
      if ((bVar1 == 0xd) || (bVar3 = bVar7, bVar1 == 10)) {
        bVar3 = false;
      }
LAB_0010ea8e:
      StringReader::pget<signed_char>(r,r->offset,1);
      r->offset = r->offset + 1;
      bVar2 = true;
      bVar7 = bVar3;
    }
    else {
      if (bVar1 == 0x2f && !disable_extensions) {
        sVar5 = StringReader::where(r);
        pcVar6 = StringReader::pget<signed_char>(r,sVar5 + 1,1);
        bVar3 = true;
        if (*pcVar6 == '/') goto LAB_0010ea8e;
      }
      bVar2 = false;
      if ((bVar1 < 0x21) && (bVar3 = bVar7, (0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
      goto LAB_0010ea8e;
    }
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

static void skip_whitespace_and_comments(StringReader& r, bool disable_extensions) {
  bool reading_comment = false;
  while (!r.eof()) {
    char ch = r.get_s8(false);
    if (reading_comment) {
      if ((ch == '\n') || (ch == '\r')) {
        reading_comment = false;
      }
    } else {
      if (!disable_extensions && (ch == '/') && (r.pget_s8(r.where() + 1) == '/')) {
        reading_comment = true;
      } else if ((ch != ' ') && (ch != '\t') && (ch != '\r') && (ch != '\n')) {
        return;
      }
    }
    r.get_s8();
  }
}